

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O1

ma_result ma_panner_process_pcm_frames
                    (ma_panner *pPanner,void *pFramesOut,void *pFramesIn,ma_uint64 frameCount)

{
  float fVar1;
  float fVar2;
  float fVar3;
  ma_uint32 mVar4;
  ma_format mVar5;
  ma_uint64 mVar6;
  size_t sVar7;
  ulong uVar8;
  ma_result mVar9;
  float factorL1;
  
  mVar9 = MA_INVALID_ARGS;
  if (pFramesIn != (void *)0x0 && (pFramesOut != (void *)0x0 && pPanner != (ma_panner *)0x0)) {
    mVar4 = pPanner->channels;
    if (mVar4 == 1) {
      mVar9 = MA_SUCCESS;
      if (pFramesOut != pFramesIn) {
        for (uVar8 = (uint)(&DAT_001bf4d0)[pPanner->format] * frameCount; uVar8 != 0;
            uVar8 = uVar8 - sVar7) {
          sVar7 = 0xffffffff;
          if (uVar8 < 0xffffffff) {
            sVar7 = uVar8;
          }
          memcpy(pFramesOut,pFramesIn,sVar7);
          pFramesOut = (void *)((long)pFramesOut + sVar7);
          pFramesIn = (void *)((long)pFramesIn + sVar7);
        }
      }
    }
    else if (mVar4 == 2) {
      mVar5 = pPanner->format;
      fVar1 = pPanner->pan;
      if (pPanner->mode == ma_pan_mode_balance) {
        if ((fVar1 == 0.0) && (!NAN(fVar1))) {
          if (pFramesOut == pFramesIn) {
            return MA_SUCCESS;
          }
          for (uVar8 = (uint)((&DAT_001bf4d0)[mVar5] * 2) * frameCount; uVar8 != 0;
              uVar8 = uVar8 - sVar7) {
            sVar7 = 0xffffffff;
            if (uVar8 < 0xffffffff) {
              sVar7 = uVar8;
            }
            memcpy(pFramesOut,pFramesIn,sVar7);
            pFramesOut = (void *)((long)pFramesOut + sVar7);
            pFramesIn = (void *)((long)pFramesIn + sVar7);
          }
          return MA_SUCCESS;
        }
        if (mVar5 != ma_format_f32) {
          if (pFramesOut == pFramesIn) {
            return MA_SUCCESS;
          }
          for (uVar8 = (uint)((&DAT_001bf4d0)[mVar5] * 2) * frameCount; uVar8 != 0;
              uVar8 = uVar8 - sVar7) {
            sVar7 = 0xffffffff;
            if (uVar8 < 0xffffffff) {
              sVar7 = uVar8;
            }
            memcpy(pFramesOut,pFramesIn,sVar7);
            pFramesOut = (void *)((long)pFramesOut + sVar7);
            pFramesIn = (void *)((long)pFramesIn + sVar7);
          }
          return MA_SUCCESS;
        }
        if (fVar1 <= 0.0) {
          if (pFramesOut == pFramesIn) {
            if (frameCount != 0) {
              mVar6 = 0;
              do {
                *(float *)((long)pFramesOut + mVar6 * 8 + 4) =
                     *(float *)((long)pFramesIn + mVar6 * 8 + 4) * (fVar1 + 1.0);
                mVar6 = mVar6 + 1;
              } while (frameCount != mVar6);
              return MA_SUCCESS;
            }
          }
          else if (frameCount != 0) {
            mVar6 = 0;
            do {
              *(undefined4 *)((long)pFramesOut + mVar6 * 8) =
                   *(undefined4 *)((long)pFramesIn + mVar6 * 8);
              *(float *)((long)pFramesOut + mVar6 * 8 + 4) =
                   *(float *)((long)pFramesIn + mVar6 * 8 + 4) * (fVar1 + 1.0);
              mVar6 = mVar6 + 1;
            } while (frameCount != mVar6);
            return MA_SUCCESS;
          }
        }
        else if (pFramesOut == pFramesIn) {
          if (frameCount != 0) {
            mVar6 = 0;
            do {
              *(float *)((long)pFramesOut + mVar6 * 8) =
                   *(float *)((long)pFramesIn + mVar6 * 8) * (1.0 - fVar1);
              mVar6 = mVar6 + 1;
            } while (frameCount != mVar6);
            return MA_SUCCESS;
          }
        }
        else if (frameCount != 0) {
          mVar6 = 0;
          do {
            *(float *)((long)pFramesOut + mVar6 * 8) =
                 *(float *)((long)pFramesIn + mVar6 * 8) * (1.0 - fVar1);
            *(undefined4 *)((long)pFramesOut + mVar6 * 8 + 4) =
                 *(undefined4 *)((long)pFramesIn + mVar6 * 8 + 4);
            mVar6 = mVar6 + 1;
          } while (frameCount != mVar6);
          return MA_SUCCESS;
        }
      }
      else {
        if ((fVar1 == 0.0) && (!NAN(fVar1))) {
          if (pFramesOut == pFramesIn) {
            return MA_SUCCESS;
          }
          for (uVar8 = (uint)((&DAT_001bf4d0)[mVar5] * 2) * frameCount; uVar8 != 0;
              uVar8 = uVar8 - sVar7) {
            sVar7 = 0xffffffff;
            if (uVar8 < 0xffffffff) {
              sVar7 = uVar8;
            }
            memcpy(pFramesOut,pFramesIn,sVar7);
            pFramesOut = (void *)((long)pFramesOut + sVar7);
            pFramesIn = (void *)((long)pFramesIn + sVar7);
          }
          return MA_SUCCESS;
        }
        if (mVar5 != ma_format_f32) {
          if (pFramesOut == pFramesIn) {
            return MA_SUCCESS;
          }
          for (uVar8 = (uint)((&DAT_001bf4d0)[mVar5] * 2) * frameCount; uVar8 != 0;
              uVar8 = uVar8 - sVar7) {
            sVar7 = 0xffffffff;
            if (uVar8 < 0xffffffff) {
              sVar7 = uVar8;
            }
            memcpy(pFramesOut,pFramesIn,sVar7);
            pFramesOut = (void *)((long)pFramesOut + sVar7);
            pFramesIn = (void *)((long)pFramesIn + sVar7);
          }
          return MA_SUCCESS;
        }
        if (fVar1 <= 0.0) {
          if (frameCount != 0) {
            mVar6 = 0;
            do {
              fVar2 = *(float *)((long)pFramesIn + mVar6 * 8 + 4);
              *(float *)((long)pFramesOut + mVar6 * 8) =
                   fVar2 * (0.0 - fVar1) + *(float *)((long)pFramesIn + mVar6 * 8);
              *(float *)((long)pFramesOut + mVar6 * 8 + 4) = fVar2 * (fVar1 + 1.0);
              mVar6 = mVar6 + 1;
            } while (frameCount != mVar6);
            return MA_SUCCESS;
          }
        }
        else if (frameCount != 0) {
          mVar6 = 0;
          do {
            fVar2 = *(float *)((long)pFramesIn + mVar6 * 8);
            fVar3 = *(float *)((long)pFramesIn + mVar6 * 8 + 4);
            *(float *)((long)pFramesOut + mVar6 * 8) = (1.0 - fVar1) * fVar2;
            *(float *)((long)pFramesOut + mVar6 * 8 + 4) = fVar2 * fVar1 + fVar3;
            mVar6 = mVar6 + 1;
          } while (frameCount != mVar6);
          return MA_SUCCESS;
        }
      }
      mVar9 = MA_SUCCESS;
    }
    else {
      mVar9 = MA_SUCCESS;
      if (pFramesOut != pFramesIn) {
        for (uVar8 = (mVar4 * (&DAT_001bf4d0)[pPanner->format]) * frameCount; uVar8 != 0;
            uVar8 = uVar8 - sVar7) {
          sVar7 = 0xffffffff;
          if (uVar8 < 0xffffffff) {
            sVar7 = uVar8;
          }
          memcpy(pFramesOut,pFramesIn,sVar7);
          pFramesOut = (void *)((long)pFramesOut + sVar7);
          pFramesIn = (void *)((long)pFramesIn + sVar7);
        }
      }
    }
  }
  return mVar9;
}

Assistant:

MA_API ma_result ma_panner_process_pcm_frames(ma_panner* pPanner, void* pFramesOut, const void* pFramesIn, ma_uint64 frameCount)
{
    if (pPanner == NULL || pFramesOut == NULL || pFramesIn == NULL) {
        return MA_INVALID_ARGS;
    }

    if (pPanner->channels == 2) {
        /* Stereo case. For now assume channel 0 is left and channel right is 1, but should probably add support for a channel map. */
        if (pPanner->mode == ma_pan_mode_balance) {
            ma_stereo_balance_pcm_frames(pFramesOut, pFramesIn, frameCount, pPanner->format, pPanner->pan);
        } else {
            ma_stereo_pan_pcm_frames(pFramesOut, pFramesIn, frameCount, pPanner->format, pPanner->pan);
        }
    } else {
        if (pPanner->channels == 1) {
            /* Panning has no effect on mono streams. */
            ma_copy_pcm_frames(pFramesOut, pFramesIn, frameCount, pPanner->format, pPanner->channels);
        } else {
            /* For now we're not going to support non-stereo set ups. Not sure how I want to handle this case just yet. */
            ma_copy_pcm_frames(pFramesOut, pFramesIn, frameCount, pPanner->format, pPanner->channels);
        }
    }

    return MA_SUCCESS;
}